

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmtp_engine.cpp
# Opt level: O1

int __thiscall zmq::zmtp_engine_t::process_heartbeat_message(zmtp_engine_t *this,msg_t *msg_)

{
  msg_t *this_00;
  ushort uVar1;
  bool bVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  undefined4 *puVar6;
  void *pvVar7;
  ulong uVar8;
  size_t __n;
  
  bVar2 = msg_t::is_ping(msg_);
  if (bVar2) {
    pvVar4 = msg_t::data(msg_);
    uVar1 = (*(ushort *)((long)pvVar4 + 5) << 8 | *(ushort *)((long)pvVar4 + 5) >> 8) * 100;
    if ((uVar1 != 0) && ((this->super_stream_engine_base_t)._has_ttl_timer == false)) {
      io_object_t::add_timer((io_object_t *)this,(uint)uVar1,0x82);
      (this->super_stream_engine_base_t)._has_ttl_timer = true;
    }
    sVar5 = msg_t::size(msg_);
    uVar8 = sVar5 - 7;
    __n = 0x10;
    if (uVar8 < 0x10) {
      __n = uVar8;
    }
    this_00 = &this->_pong_msg;
    iVar3 = msg_t::init_size(this_00,__n + 5);
    if (iVar3 != 0) {
      process_heartbeat_message();
    }
    msg_t::set_flags(this_00,'\x02');
    puVar6 = (undefined4 *)msg_t::data(this_00);
    *puVar6 = 0x4e4f5004;
    *(undefined1 *)(puVar6 + 1) = 0x47;
    if (uVar8 != 0) {
      pvVar4 = msg_t::data(this_00);
      pvVar7 = msg_t::data(msg_);
      memcpy((void *)((long)pvVar4 + 5),(void *)((long)pvVar7 + 7),__n);
    }
    (this->super_stream_engine_base_t)._next_msg = 0x99;
    *(undefined8 *)&(this->super_stream_engine_base_t).field_0x550 = 0;
    stream_engine_base_t::out_event(&this->super_stream_engine_base_t);
  }
  return 0;
}

Assistant:

int zmq::zmtp_engine_t::process_heartbeat_message (msg_t *msg_)
{
    if (msg_->is_ping ()) {
        // 16-bit TTL + \4PING == 7
        const size_t ping_ttl_len = msg_t::ping_cmd_name_size + 2;
        const size_t ping_max_ctx_len = 16;
        uint16_t remote_heartbeat_ttl;

        // Get the remote heartbeat TTL to setup the timer
        memcpy (&remote_heartbeat_ttl,
                static_cast<uint8_t *> (msg_->data ())
                  + msg_t::ping_cmd_name_size,
                ping_ttl_len - msg_t::ping_cmd_name_size);
        remote_heartbeat_ttl = ntohs (remote_heartbeat_ttl);
        // The remote heartbeat is in 10ths of a second
        // so we multiply it by 100 to get the timer interval in ms.
        remote_heartbeat_ttl *= 100;

        if (!_has_ttl_timer && remote_heartbeat_ttl > 0) {
            add_timer (remote_heartbeat_ttl, heartbeat_ttl_timer_id);
            _has_ttl_timer = true;
        }

        //  As per ZMTP 3.1 the PING command might contain an up to 16 bytes
        //  context which needs to be PONGed back, so build the pong message
        //  here and store it. Truncate it if it's too long.
        //  Given the engine goes straight to out_event, sequential PINGs will
        //  not be a problem.
        const size_t context_len =
          std::min (msg_->size () - ping_ttl_len, ping_max_ctx_len);
        const int rc =
          _pong_msg.init_size (msg_t::ping_cmd_name_size + context_len);
        errno_assert (rc == 0);
        _pong_msg.set_flags (msg_t::command);
        memcpy (_pong_msg.data (), "\4PONG", msg_t::ping_cmd_name_size);
        if (context_len > 0)
            memcpy (static_cast<uint8_t *> (_pong_msg.data ())
                      + msg_t::ping_cmd_name_size,
                    static_cast<uint8_t *> (msg_->data ()) + ping_ttl_len,
                    context_len);

        _next_msg = static_cast<int (stream_engine_base_t::*) (msg_t *)> (
          &zmtp_engine_t::produce_pong_message);
        out_event ();
    }

    return 0;
}